

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageHandler.cpp
# Opt level: O0

MessageType getMessageType(Document *message)

{
  bool bVar1;
  bool bVar2;
  bool hasMethod;
  bool hasId;
  Document *message_local;
  
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(&message->
                       super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ,"id");
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(&message->
                       super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ,"method");
  if (bVar1) {
    if (bVar2) {
      message_local._4_4_ = Request;
    }
    else {
      message_local._4_4_ = Response;
    }
  }
  else if (bVar2) {
    message_local._4_4_ = Notification;
  }
  else {
    message_local._4_4_ = Unknown;
  }
  return message_local._4_4_;
}

Assistant:

MessageType getMessageType (Document &message) {
    bool hasId = message.HasMember("id");
    bool hasMethod = message.HasMember("method");

    if (hasId) {
        if (hasMethod) {
            return MessageType::Request;
        }
        return MessageType::Response;
    }

    if (hasMethod) {
        return MessageType::Notification;
    }

    return MessageType::Unknown;
}